

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryIsFrozen(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptLibrary *pJVar7;
  JavascriptBoolean *pJVar8;
  GlobalObject *this_00;
  GlobalObject *this_01;
  GlobalObject *pGVar9;
  GlobalObject *globalObject;
  BOOL isFrozen;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3df,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x3e2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar3 = Js::JavascriptOperators::IsObject(pvVar6);
    if (BVar3 != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      this_00 = (GlobalObject *)VarTo<Js::RecyclableObject>(pvVar6);
      globalObject._4_4_ =
           (*(this_00->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
             super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3a]
           )();
      pJVar7 = RecyclableObject::GetLibrary((RecyclableObject *)this_00);
      this_01 = JavascriptLibrary::GetGlobalObject(pJVar7);
      if ((((globalObject._4_4_ != 0) && (this_01 != this_00)) && (this_01 != (GlobalObject *)0x0))
         && (pGVar9 = (GlobalObject *)GlobalObject::ToThis(this_01), pGVar9 == this_00)) {
        globalObject._4_4_ =
             (*(this_01->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x3a])();
      }
      pJVar7 = ScriptContext::GetLibrary(pSVar4);
      pvVar6 = JavascriptLibrary::GetTrueOrFalse(pJVar7,globalObject._4_4_);
      return pvVar6;
    }
  }
  pJVar7 = ScriptContext::GetLibrary(pSVar4);
  pJVar8 = JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
  return pJVar8;
}

Assistant:

Var JavascriptObject::EntryIsFrozen(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));
    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_isFrozen);

    if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
    {
        return scriptContext->GetLibrary()->GetTrue();
    }

    RecyclableObject *object = VarTo<RecyclableObject>(args[1]);

    BOOL isFrozen = object->IsFrozen();

    GlobalObject* globalObject = object->GetLibrary()->GetGlobalObject();
    if (isFrozen && globalObject != object && globalObject && (globalObject->ToThis() == object))
    {
        isFrozen = globalObject->IsFrozen();
    }

    return scriptContext->GetLibrary()->GetTrueOrFalse(isFrozen);
}